

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::cxx::CxxGenerator::Generate
          (CxxGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  GeneratorContext *pGVar1;
  int iVar2;
  ZeroCopyOutputStream *pZVar3;
  undefined4 extraout_var_00;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  Printer printer;
  string basename;
  Options file_options;
  FileGenerator file_generator;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  Printer local_138;
  string local_f0;
  string *local_d0;
  GeneratorContext *local_c8;
  Options local_c0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88 [5];
  undefined4 extraout_var;
  
  local_158.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = error;
  local_c8 = generator_context;
  ParseGeneratorParameter(parameter,&local_158);
  local_c0.dllexport_decl._M_dataplus._M_p = (pointer)&local_c0.dllexport_decl.field_2;
  local_c0.dllexport_decl._M_string_length = 0;
  local_c0.dllexport_decl.field_2._M_local_buf[0] = '\0';
  local_c0.safe_boundary_check = false;
  if (local_158.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_158.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      iVar2 = std::__cxx11::string::compare
                        ((char *)((long)&((local_158.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + lVar6));
      if (iVar2 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_c0);
      }
      else {
        iVar2 = std::__cxx11::string::compare
                          ((char *)((long)&((local_158.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first).
                                           _M_dataplus._M_p + lVar6));
        if (iVar2 != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,"Unknown generator option: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((local_158.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                 _M_p + lVar6));
          std::__cxx11::string::operator=((string *)local_d0,(string *)local_98);
          if ((FileDescriptor *)local_98._0_8_ != (FileDescriptor *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88[0]._M_allocated_capacity + 1));
          }
          bVar4 = false;
          goto LAB_001badcf;
        }
        local_c0.safe_boundary_check = true;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x40;
    } while (uVar5 < (ulong)((long)local_158.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_158.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  StripProto(&local_f0,*(string **)file);
  std::__cxx11::string::append((char *)&local_f0);
  FileGenerator::FileGenerator((FileGenerator *)local_98,file,&local_c0);
  pGVar1 = local_c8;
  lVar6 = (long)&local_138 + 0x10;
  local_138._0_8_ = lVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_f0._M_dataplus._M_p,
             local_f0._M_dataplus._M_p + local_f0._M_string_length);
  std::__cxx11::string::append(&local_138.variable_delimiter_);
  iVar2 = (*pGVar1->_vptr_GeneratorContext[2])(pGVar1,&local_138);
  pZVar3 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  if (local_138._0_8_ != lVar6) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_138.buffer_ + 1));
  }
  io::Printer::Printer(&local_138,pZVar3,'$');
  FileGenerator::GenerateHeader((FileGenerator *)local_98,&local_138);
  io::Printer::~Printer(&local_138);
  if (pZVar3 != (ZeroCopyOutputStream *)0x0) {
    (*pZVar3->_vptr_ZeroCopyOutputStream[1])(pZVar3);
  }
  local_138._0_8_ = lVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_f0._M_dataplus._M_p,
             local_f0._M_dataplus._M_p + local_f0._M_string_length);
  std::__cxx11::string::append(&local_138.variable_delimiter_);
  iVar2 = (*pGVar1->_vptr_GeneratorContext[2])(pGVar1,&local_138);
  pZVar3 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2);
  if (local_138._0_8_ != lVar6) {
    operator_delete((void *)local_138._0_8_,(ulong)(local_138.buffer_ + 1));
  }
  io::Printer::Printer(&local_138,pZVar3,'$');
  FileGenerator::GenerateSource((FileGenerator *)local_98,&local_138);
  io::Printer::~Printer(&local_138);
  if (pZVar3 != (ZeroCopyOutputStream *)0x0) {
    (*pZVar3->_vptr_ZeroCopyOutputStream[1])(pZVar3);
  }
  FileGenerator::~FileGenerator((FileGenerator *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  bVar4 = true;
LAB_001badcf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.dllexport_decl._M_dataplus._M_p != &local_c0.dllexport_decl.field_2) {
    operator_delete(local_c0.dllexport_decl._M_dataplus._M_p,
                    CONCAT71(local_c0.dllexport_decl.field_2._M_allocated_capacity._1_7_,
                             local_c0.dllexport_decl.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_158);
  return bVar4;
}

Assistant:

bool CxxGenerator::Generate(const FileDescriptor* file,
                            const string& parameter,
                            GeneratorContext* generator_context,
                            string* error) const {
  vector<pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // TODO(kenton):  If we ever have more options, we may want to create a
  //   class that encapsulates them which we can pass down to all the
  //   generator classes.  Currently we pass dllexport_decl down to all of
  //   them via the constructors, but we don't want to have to add another
  //   constructor parameter for every option.

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cxx_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  Options file_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // -----------------------------------------------------------------


  string basename = StripProto(file->name());
  basename.append(".pb");

  FileGenerator file_generator(file, file_options);

  // Generate header.
  {
    scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(basename + ".h"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateHeader(&printer);
  }

  // Generate cc file.
  {
    scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(basename + ".cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}